

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-entry.c
# Opt level: O0

parser_error parse_entry_shortened_label(parser *p)

{
  _Bool _Var1;
  wchar_t wVar2;
  long *plVar3;
  char *pcVar4;
  size_t sVar5;
  wchar_t local_5c;
  size_t nw2;
  size_t nw;
  char *name;
  wchar_t n;
  embryonic_ui_entry *embryo;
  parser *p_local;
  
  plVar3 = (long *)parser_priv(p);
  name._4_4_ = L'\x01';
  if (plVar3 == (long *)0x0) {
    p_local._4_4_ = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    for (; name._4_4_ < L'\v'; name._4_4_ = name._4_4_ + L'\x01') {
      pcVar4 = format("label%d",(ulong)(uint)name._4_4_);
      _Var1 = parser_hasval(p,pcVar4);
      if (_Var1) {
        pcVar4 = format("label%d",(ulong)(uint)name._4_4_);
        pcVar4 = parser_getstr(p,pcVar4);
        sVar5 = text_mbstowcs(*(wchar_t **)(*plVar3 + 0x28 + (long)(name._4_4_ + L'\xffffffff') * 8)
                              ,pcVar4,name._4_4_);
        if (sVar5 == 0xffffffffffffffff) {
          return PARSE_ERROR_INVALID_VALUE;
        }
        wVar2 = (wchar_t)sVar5;
        local_5c = wVar2;
        if (name._4_4_ <= wVar2) {
          local_5c = name._4_4_;
        }
        sVar5 = text_mbstowcs((wchar_t *)
                              (*(long *)(*plVar3 + 0x28 + (long)(name._4_4_ + L'\xffffffff') * 8) +
                              (long)local_5c * 4),"",L'\x01');
        if (sVar5 != 0xffffffffffffffff) {
          *(wchar_t *)(*plVar3 + 0x17c + (long)(name._4_4_ + L'\xffffffff') * 4) = wVar2;
          return PARSE_ERROR_NONE;
        }
        return PARSE_ERROR_INVALID_VALUE;
      }
    }
    p_local._4_4_ = PARSE_ERROR_INTERNAL;
  }
  return p_local._4_4_;
}

Assistant:

static enum parser_error parse_entry_shortened_label(struct parser *p)
{
	struct embryonic_ui_entry *embryo = parser_priv(p);
	int n = 1;
	const char *name;
	size_t nw;

	if (!embryo) {
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	}
	while (1) {
		if (n > MAX_SHORTENED) {
			return PARSE_ERROR_INTERNAL;
		}
		if (parser_hasval(p, format("label%d", n))) {
			break;
		}
		++n;
	}
	name = parser_getstr(p, format("label%d", n));
	nw = text_mbstowcs(embryo->entry->shortened_labels[n - 1], name, n);
	if (nw != (size_t) -1) {
		/* Ensure null termination. */
		size_t nw2 = text_mbstowcs(
			embryo->entry->shortened_labels[n - 1] +
			((int)nw < n ? (int)nw : n), "", 1);

		if (nw2 != (size_t)-1) {
			embryo->entry->nshortened[n - 1] = nw;
		} else {
			return PARSE_ERROR_INVALID_VALUE;
		}
	} else {
		return PARSE_ERROR_INVALID_VALUE;
	}
	return PARSE_ERROR_NONE;
}